

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::break_stmt(analysis *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar1;
  int local_5c;
  string local_58;
  string local_38;
  
  local_5c = token::getLineno((in_RSI->tmp).
                              super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::make_shared<dh::TreeNode,char_const(&)[6],int>((char (*) [6])this,(int *)"break");
  std::__cxx11::string::string((string *)&local_38,"break",(allocator *)&local_5c);
  match(in_RSI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_5c = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,&local_5c);
  local_5c = 4;
  TreeNode::setKind(*(TreeNode **)this,&local_5c);
  std::__cxx11::string::string((string *)&local_58,";",(allocator *)&local_5c);
  match(in_RSI,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  NVar1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar1.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::break_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in break_stmt\n";
#endif

	NodePtr ret = ::std::make_shared<TreeNode>("break",tmp->getLineno());
	match("break");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::BreakK);
	match(";");

	return ret;
}